

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O3

bool __thiscall cmCTestUpdateHandler::SelectVCS(cmCTestUpdateHandler *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  char *cmd;
  int iVar3;
  string *dir;
  size_t sVar4;
  ostream *poVar5;
  bool bVar6;
  char *pcVar7;
  uint uVar8;
  ostringstream e;
  ostringstream cmCTestLog_msg;
  long *local_348;
  long local_340;
  long local_338 [2];
  char *local_328;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"UpdateCommand","");
  cmCTest::GetCTestConfiguration((string *)local_320,pcVar2,(string *)local_1a8);
  std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)local_320);
  pcVar7 = local_320 + 0x10;
  if ((char *)local_320._0_8_ != pcVar7) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_320._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"SourceDirectory","");
  dir = (string *)
        cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_320);
  if (dir == (string *)0x0) {
    dir = &cmValue::Empty_abi_cxx11_;
  }
  iVar3 = DetectVCS(this,dir);
  this->UpdateType = iVar3;
  if ((char *)local_320._0_8_ != pcVar7) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    iVar3 = this->UpdateType;
  }
  if (iVar3 == 0) {
    cmd = (this->UpdateCommand)._M_dataplus._M_p;
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"UpdateType","");
    cmCTest::GetCTestConfiguration((string *)local_320,pcVar2,(string *)local_1a8);
    iVar3 = DetermineType(this,cmd,(char *)local_320._0_8_);
    this->UpdateType = iVar3;
    if ((char *)local_320._0_8_ != pcVar7) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  bVar6 = true;
  if ((this->UpdateCommand)._M_string_length == 0) {
    uVar8 = this->UpdateType - 1;
    if (uVar8 < 6) {
      local_328 = (&PTR_anon_var_dwarf_25bc65b_009ab398)[uVar8];
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_328,(allocator<char> *)&local_348);
      cmCTest::GetCTestConfiguration((string *)local_320,pcVar2,(string *)local_1a8);
      std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)local_320);
      if ((char *)local_320._0_8_ != pcVar7) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      pcVar7 = local_328;
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((this->UpdateCommand)._M_string_length != 0) {
        return true;
      }
    }
    else {
      pcVar7 = (char *)0x0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"Cannot find UpdateCommand ",0x1a);
    if (uVar8 < 6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"or ",3);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)&local_348 + (int)*(undefined8 *)(local_320._0_8_ + -0x18) + 0x28);
      }
      else {
        sVar4 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar4);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320," configuration key.",0x13);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__cxx11::stringbuf::str();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_348,local_340);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_348 != local_338) {
      operator_delete(local_348,local_338[0] + 1);
    }
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x15c,(char *)local_348,false);
    if (local_348 != local_338) {
      operator_delete(local_348,local_338[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool cmCTestUpdateHandler::SelectVCS()
{
  // Get update command
  this->UpdateCommand = this->CTest->GetCTestConfiguration("UpdateCommand");

  // Detect the VCS managing the source tree.
  this->UpdateType = this->DetectVCS(this->GetOption("SourceDirectory"));
  if (this->UpdateType == e_UNKNOWN) {
    // The source tree does not have a recognized VCS.  Check the
    // configuration value or command name.
    this->UpdateType = this->DetermineType(
      this->UpdateCommand.c_str(),
      this->CTest->GetCTestConfiguration("UpdateType").c_str());
  }

  // If no update command was specified, lookup one for this VCS tool.
  if (this->UpdateCommand.empty()) {
    const char* key = nullptr;
    switch (this->UpdateType) {
      case e_CVS:
        key = "CVSCommand";
        break;
      case e_SVN:
        key = "SVNCommand";
        break;
      case e_BZR:
        key = "BZRCommand";
        break;
      case e_GIT:
        key = "GITCommand";
        break;
      case e_HG:
        key = "HGCommand";
        break;
      case e_P4:
        key = "P4Command";
        break;
      default:
        break;
    }
    if (key) {
      this->UpdateCommand = this->CTest->GetCTestConfiguration(key);
    }
    if (this->UpdateCommand.empty()) {
      std::ostringstream e;
      e << "Cannot find UpdateCommand ";
      if (key) {
        e << "or " << key;
      }
      e << " configuration key.";
      cmCTestLog(this->CTest, ERROR_MESSAGE, e.str() << std::endl);
      return false;
    }
  }

  return true;
}